

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

string * __thiscall
libcellml::Component::math_abi_cxx11_(string *__return_storage_ptr__,Component *this)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = pEVar1[4].mId.field_2._M_allocated_capacity;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,sVar2,
             *(long *)((long)&pEVar1[4].mId.field_2 + 8) + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Component::math() const
{
    return pFunc()->mMath;
}